

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_shutdown(filemgr *file,err_log_callback *log_callback)

{
  fdb_status new_val;
  atomic<unsigned_long> *in_RSI;
  fdb_status wr;
  err_log_callback *in_stack_00000198;
  void *in_stack_000001a0;
  wal_discard_t in_stack_000001ac;
  filemgr *in_stack_000001b0;
  memory_order in_stack_ffffffffffffffe8;
  
  new_val = _wal_close(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198);
  atomic_store_uint32_t((atomic<unsigned_int> *)in_RSI,new_val,in_stack_ffffffffffffffe8);
  atomic_store_uint32_t((atomic<unsigned_int> *)in_RSI,new_val,in_stack_ffffffffffffffe8);
  atomic_store_uint64_t(in_RSI,CONCAT44(new_val,in_stack_ffffffffffffffe8),memory_order_relaxed);
  atomic_store_uint64_t(in_RSI,CONCAT44(new_val,in_stack_ffffffffffffffe8),memory_order_relaxed);
  atomic_store_uint8_t
            ((atomic<unsigned_char> *)in_RSI,(uint8_t)((uint)new_val >> 0x18),
             in_stack_ffffffffffffffe8);
  return new_val;
}

Assistant:

fdb_status wal_shutdown(struct filemgr *file, err_log_callback *log_callback)
{
    fdb_status wr = _wal_close(file, WAL_DISCARD_ALL, NULL, log_callback);
    atomic_store_uint32_t(&file->wal->size, 0);
    atomic_store_uint32_t(&file->wal->num_flushable, 0);
    atomic_store_uint64_t(&file->wal->datasize, 0);
    atomic_store_uint64_t(&file->wal->mem_overhead, 0);
    atomic_store_uint8_t(&file->wal->isPopulated, 0);
    return wr;
}